

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TracingServiceImpl::ProducerEndpointImpl::SetupDataSource
          (ProducerEndpointImpl *this,DataSourceInstanceID ds_id,DataSourceConfig *config)

{
  TaskRunner *pTVar1;
  uint32_t uVar2;
  pair<std::_Rb_tree_const_iterator<unsigned_short>,_bool> pVar3;
  anon_class_824_3_b972a174 local_3a0;
  function<void_()> local_68;
  undefined1 local_48 [8];
  WeakPtr<perfetto::TracingServiceImpl::ProducerEndpointImpl> weak_this;
  value_type_conflict6 local_22;
  DataSourceConfig *local_20;
  DataSourceConfig *config_local;
  DataSourceInstanceID ds_id_local;
  ProducerEndpointImpl *this_local;
  
  local_20 = config;
  config_local = (DataSourceConfig *)ds_id;
  ds_id_local = (DataSourceInstanceID)this;
  uVar2 = protos::gen::DataSourceConfig::target_buffer(config);
  local_22 = (value_type_conflict6)uVar2;
  pVar3 = std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::
          insert(&this->allowed_target_buffers_,&local_22);
  weak_this.handle_.
  super___shared_ptr<perfetto::TracingServiceImpl::ProducerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar3.first._M_node;
  perfetto::base::WeakPtrFactory<perfetto::TracingServiceImpl::ProducerEndpointImpl>::GetWeakPtr
            ((WeakPtrFactory<perfetto::TracingServiceImpl::ProducerEndpointImpl> *)local_48);
  pTVar1 = this->task_runner_;
  perfetto::base::WeakPtr<perfetto::TracingServiceImpl::ProducerEndpointImpl>::WeakPtr
            (&local_3a0.weak_this,
             (WeakPtr<perfetto::TracingServiceImpl::ProducerEndpointImpl> *)local_48);
  local_3a0.ds_id = (DataSourceInstanceID)config_local;
  protos::gen::DataSourceConfig::DataSourceConfig(&local_3a0.config,local_20);
  ::std::function<void()>::
  function<perfetto::TracingServiceImpl::ProducerEndpointImpl::SetupDataSource(unsigned_long,perfetto::protos::gen::DataSourceConfig_const&)::__0,void>
            ((function<void()> *)&local_68,&local_3a0);
  (*pTVar1->_vptr_TaskRunner[2])(pTVar1,&local_68);
  ::std::function<void_()>::~function(&local_68);
  SetupDataSource(unsigned_long,perfetto::protos::gen::DataSourceConfig_const&)::$_0::~__0
            ((__0 *)&local_3a0);
  perfetto::base::WeakPtr<perfetto::TracingServiceImpl::ProducerEndpointImpl>::~WeakPtr
            ((WeakPtr<perfetto::TracingServiceImpl::ProducerEndpointImpl> *)local_48);
  return;
}

Assistant:

void TracingServiceImpl::ProducerEndpointImpl::SetupDataSource(
    DataSourceInstanceID ds_id,
    const DataSourceConfig& config) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  allowed_target_buffers_.insert(static_cast<BufferID>(config.target_buffer()));
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner_->PostTask([weak_this, ds_id, config] {
    if (weak_this)
      weak_this->producer_->SetupDataSource(ds_id, std::move(config));
  });
}